

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
::iterator::skip_empty_or_deleted(iterator *this)

{
  uint32_t uVar1;
  ctrl_t *pcVar2;
  GroupSse2Impl local_28;
  
  pcVar2 = this->ctrl_;
  while (*pcVar2 < kSentinel) {
    local_28.ctrl[0] = *(longlong *)pcVar2;
    local_28.ctrl[1] = *(longlong *)(pcVar2 + 8);
    uVar1 = GroupSse2Impl::CountLeadingEmptyOrDeleted(&local_28);
    pcVar2 = this->ctrl_ + uVar1;
    this->ctrl_ = pcVar2;
    (this->field_1).slot_ = (this->field_1).slot_ + uVar1;
  }
  return;
}

Assistant:

void skip_empty_or_deleted() {
      while (IsEmptyOrDeleted(*ctrl_)) {
        uint32_t shift =
            GroupFullEmptyOrDeleted{ctrl_}.CountLeadingEmptyOrDeleted();
        ctrl_ += shift;
        slot_ += shift;
      }
    }